

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

void __thiscall
anurbs::RTree<2L>::sort
          (RTree<2L> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,Index left,
          Index right)

{
  ulong uVar1;
  reference pvVar2;
  size_type __n;
  undefined8 local_40;
  Index j;
  Index i;
  size_t pivot;
  Index right_local;
  Index left_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values_local;
  RTree<2L> *this_local;
  
  if (left < right) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (values,left + right >> 1);
    uVar1 = *pvVar2;
    j = left + -1;
    local_40 = right + 1;
    while( true ) {
      do {
        j = j + 1;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](values,j);
        __n = local_40;
      } while (*pvVar2 < uVar1);
      do {
        local_40 = __n;
        __n = local_40 - 1;
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](values,__n);
      } while (uVar1 < *pvVar2);
      if ((long)__n <= j) break;
      swap(this,values,j,__n);
      local_40 = __n;
    }
    sort(this,values,left,__n);
    sort(this,values,local_40,right);
  }
  return;
}

Assistant:

void sort(std::vector<size_t>& values, const Index left, const Index right)
    {
        if (left >= right) {
            return;
        }

        const size_t pivot = values[(left + right) >> 1];

        Index i = left - 1;
        Index j = right + 1;

        while (true) {
            do {
                i += 1;
            } while(values[i] < pivot);

            do {
                j -= 1;
            } while(values[j] > pivot);

            if (i >= j) {
                break;
            }

            swap(values, i, j);
        }

        sort(values, left, j);
        sort(values, j + 1, right);
    }